

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall stackjit::ExecutionEngine::~ExecutionEngine(ExecutionEngine *this)

{
  _Hash_node_base *p_Var1;
  pointer pcVar2;
  _Hash_node_base *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
  func;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  _Hash_node_base *local_30;
  
  p_Var3 = (this->mLoadedFunctions)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,p_Var3[1]._M_nxt,
                 (long)&(p_Var3[1]._M_nxt)->_M_nxt + (long)&(p_Var3[2]._M_nxt)->_M_nxt);
      p_Var1 = p_Var3[5]._M_nxt;
      local_30 = p_Var1;
      if (p_Var1 != (_Hash_node_base *)0x0) {
        if (p_Var1[8]._M_nxt != (_Hash_node_base *)0x0) {
          operator_delete(p_Var1[8]._M_nxt);
        }
        std::vector<stackjit::Instruction,_std::allocator<stackjit::Instruction>_>::~vector
                  ((vector<stackjit::Instruction,_std::allocator<stackjit::Instruction>_> *)
                   (p_Var1 + 5));
        if (p_Var1[1]._M_nxt != (_Hash_node_base *)0x0) {
          operator_delete(p_Var1[1]._M_nxt);
        }
        operator_delete(p_Var1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mLoadedFunctions)._M_h);
  ImageContainer::~ImageContainer(&this->mImageContainer);
  pcVar2 = (this->mBaseDir)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->mBaseDir).field_2) {
    operator_delete(pcVar2);
  }
  CallStack::~CallStack(&this->mCallStack);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::FunctionCompilationData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::FunctionCompilationData>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mJIT).mFunctions._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(stackjit::MacroFunctionContext)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(stackjit::MacroFunctionContext)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mJIT).mCodeGenerator.mMacros._M_h);
  MemoryManager::~MemoryManager(&(this->mJIT).mMemoryManager);
  return;
}

Assistant:

ExecutionEngine::~ExecutionEngine() {
		for (auto func : mLoadedFunctions) {
			delete func.second;
		}
	}